

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-customop.c
# Opt level: O1

int main(int argc,char **argv)

{
  void *pvVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  undefined4 in_register_0000003c;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM6 [64];
  float fVar21;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  float fVar30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  ggml_tensor *args [5];
  float buf1_f32 [1024];
  float buf2_f32 [1024];
  float buf3_f32 [1024];
  long local_3068;
  long local_3060;
  long local_3058;
  long local_3050;
  long local_3048;
  float local_3038 [3074];
  
  auVar19 = ZEXT3264(_DAT_00103020);
  auVar20 = ZEXT3264(_DAT_00103040);
  lVar5 = 0;
  auVar2 = vpcmpeqd_avx2(in_ZMM6._0_32_,in_ZMM6._0_32_);
  auVar15._8_4_ = 0x4b000000;
  auVar15._0_8_ = 0x4b0000004b000000;
  auVar15._12_4_ = 0x4b000000;
  auVar15._16_4_ = 0x4b000000;
  auVar15._20_4_ = 0x4b000000;
  auVar15._24_4_ = 0x4b000000;
  auVar15._28_4_ = 0x4b000000;
  auVar16._8_4_ = 0x53000000;
  auVar16._0_8_ = 0x5300000053000000;
  auVar16._12_4_ = 0x53000000;
  auVar16._16_4_ = 0x53000000;
  auVar16._20_4_ = 0x53000000;
  auVar16._24_4_ = 0x53000000;
  auVar16._28_4_ = 0x53000000;
  auVar17._8_4_ = 0x53000080;
  auVar17._0_8_ = 0x5300008053000080;
  auVar17._12_4_ = 0x53000080;
  auVar17._16_4_ = 0x53000080;
  auVar17._20_4_ = 0x53000080;
  auVar17._24_4_ = 0x53000080;
  auVar17._28_4_ = 0x53000080;
  auVar18._8_8_ = 8;
  auVar18._0_8_ = 8;
  auVar18._16_8_ = 8;
  auVar18._24_8_ = 8;
  do {
    auVar22 = vperm2f128_avx(auVar20._0_32_,auVar19._0_32_,0x31);
    auVar31._16_16_ = auVar19._0_16_;
    auVar31._0_16_ = auVar20._0_16_;
    auVar22 = vshufps_avx(auVar31,auVar22,0x88);
    auVar22 = vpsubd_avx2(auVar22,auVar2);
    auVar31 = vpblendw_avx2(auVar22,auVar15,0xaa);
    auVar22 = vpsrld_avx2(auVar22,0x10);
    auVar22 = vpblendw_avx2(auVar22,auVar16,0xaa);
    auVar22 = vsubps_avx(auVar22,auVar17);
    local_3038[lVar5] = auVar31._0_4_ + auVar22._0_4_;
    local_3038[lVar5 + 1] = auVar31._4_4_ + auVar22._4_4_;
    local_3038[lVar5 + 2] = auVar31._8_4_ + auVar22._8_4_;
    local_3038[lVar5 + 3] = auVar31._12_4_ + auVar22._12_4_;
    local_3038[lVar5 + 4] = auVar31._16_4_ + auVar22._16_4_;
    local_3038[lVar5 + 5] = auVar31._20_4_ + auVar22._20_4_;
    local_3038[lVar5 + 6] = auVar31._24_4_ + auVar22._24_4_;
    local_3038[lVar5 + 7] = auVar31._28_4_ + auVar22._28_4_;
    lVar5 = lVar5 + 8;
    auVar22 = vpaddq_avx2(auVar20._0_32_,auVar18);
    auVar20 = ZEXT3264(auVar22);
    auVar22 = vpaddq_avx2(auVar19._0_32_,auVar18);
    auVar19 = ZEXT3264(auVar22);
  } while (lVar5 != 0x400);
  lVar5 = 0;
  auVar31 = vpcmpeqd_avx2(auVar2,auVar2);
  auVar22 = _DAT_00103020;
  auVar2 = _DAT_00103040;
  do {
    auVar23 = vperm2f128_avx(auVar2,auVar22,0x31);
    auVar32._16_16_ = auVar22._0_16_;
    auVar32._0_16_ = auVar2._0_16_;
    auVar23 = vshufps_avx(auVar32,auVar23,0x88);
    auVar23 = vpsubd_avx2(auVar23,auVar31);
    auVar32 = vpblendw_avx2(auVar23,auVar15,0xaa);
    auVar23 = vpsrld_avx2(auVar23,0x10);
    auVar23 = vpblendw_avx2(auVar23,auVar16,0xaa);
    auVar23 = vsubps_avx(auVar23,auVar17);
    fVar21 = auVar32._0_4_ + auVar23._0_4_;
    fVar24 = auVar32._4_4_ + auVar23._4_4_;
    fVar25 = auVar32._8_4_ + auVar23._8_4_;
    fVar26 = auVar32._12_4_ + auVar23._12_4_;
    fVar27 = auVar32._16_4_ + auVar23._16_4_;
    fVar28 = auVar32._20_4_ + auVar23._20_4_;
    fVar29 = auVar32._24_4_ + auVar23._24_4_;
    fVar30 = auVar32._28_4_ + auVar23._28_4_;
    local_3038[lVar5 + 0x400] = fVar21 + fVar21;
    local_3038[lVar5 + 0x401] = fVar24 + fVar24;
    local_3038[lVar5 + 0x402] = fVar25 + fVar25;
    local_3038[lVar5 + 0x403] = fVar26 + fVar26;
    local_3038[lVar5 + 0x404] = fVar27 + fVar27;
    local_3038[lVar5 + 0x405] = fVar28 + fVar28;
    local_3038[lVar5 + 0x406] = fVar29 + fVar29;
    local_3038[lVar5 + 0x407] = fVar30 + fVar30;
    lVar5 = lVar5 + 8;
    auVar2 = vpaddq_avx2(auVar2,auVar18);
    auVar22 = vpaddq_avx2(auVar22,auVar18);
  } while (lVar5 != 0x400);
  lVar5 = 0;
  auVar31 = vpcmpeqd_avx2(auVar31,auVar31);
  auVar22 = _DAT_00103020;
  auVar2 = _DAT_00103040;
  do {
    auVar23 = vperm2f128_avx(auVar2,auVar22,0x31);
    auVar33._16_16_ = auVar22._0_16_;
    auVar33._0_16_ = auVar2._0_16_;
    auVar23 = vshufps_avx(auVar33,auVar23,0x88);
    auVar23 = vpsubd_avx2(auVar23,auVar31);
    auVar32 = vpblendw_avx2(auVar23,auVar15,0xaa);
    auVar23 = vpsrld_avx2(auVar23,0x10);
    auVar23 = vpblendw_avx2(auVar23,auVar16,0xaa);
    auVar23 = vsubps_avx(auVar23,auVar17);
    local_3038[lVar5 + 0x800] = (auVar32._0_4_ + auVar23._0_4_) * 3.0;
    local_3038[lVar5 + 0x801] = (auVar32._4_4_ + auVar23._4_4_) * 3.0;
    local_3038[lVar5 + 0x802] = (auVar32._8_4_ + auVar23._8_4_) * 3.0;
    local_3038[lVar5 + 0x803] = (auVar32._12_4_ + auVar23._12_4_) * 3.0;
    local_3038[lVar5 + 0x804] = (auVar32._16_4_ + auVar23._16_4_) * 3.0;
    local_3038[lVar5 + 0x805] = (auVar32._20_4_ + auVar23._20_4_) * 3.0;
    local_3038[lVar5 + 0x806] = (auVar32._24_4_ + auVar23._24_4_) * 3.0;
    local_3038[lVar5 + 0x807] = auVar32._28_4_ + auVar23._28_4_;
    lVar5 = lVar5 + 8;
    auVar2 = vpaddq_avx2(auVar2,auVar18);
    auVar22 = vpaddq_avx2(auVar22,auVar18);
  } while (lVar5 != 0x400);
  uVar6 = ggml_init(CONCAT44(in_register_0000003c,argc));
  lVar5 = ggml_new_tensor_2d(uVar6,0,10,2);
  pvVar1 = *(void **)(lVar5 + 0xf8);
  sVar7 = ggml_nbytes(lVar5);
  memcpy(pvVar1,local_3038,sVar7);
  uVar8 = ggml_map_custom1(uVar6,lVar5,custom1,2,0);
  uVar9 = ggml_new_graph(uVar6);
  ggml_build_forward_expand(uVar9,uVar8);
  ggml_graph_compute_with_ctx(uVar6,uVar9,4);
  lVar5 = ggml_get_data_f32(uVar8);
  lVar10 = ggml_nelements(uVar8);
  if (0 < lVar10) {
    lVar10 = 0;
    do {
      fVar21 = *(float *)(lVar5 + lVar10 * 4);
      fVar24 = local_3038[lVar10] + local_3038[lVar10];
      if ((fVar21 != fVar24) || (NAN(fVar21) || NAN(fVar24))) {
        pcVar14 = "output[i] == buf1_f32[i] * 2";
        uVar6 = 0xc9;
        goto LAB_0010243a;
      }
      lVar10 = lVar10 + 1;
      lVar11 = ggml_nelements(uVar8);
    } while (lVar10 < lVar11);
  }
  if (g_custom1_count == 2) {
    ggml_free(uVar6);
    uVar6 = ggml_init();
    lVar5 = ggml_new_tensor_2d(uVar6,0,10,2);
    lVar10 = ggml_new_tensor_2d(uVar6,0,10,2);
    pvVar1 = *(void **)(lVar5 + 0xf8);
    sVar7 = ggml_nbytes(lVar5);
    memcpy(pvVar1,local_3038,sVar7);
    pvVar1 = *(void **)(lVar10 + 0xf8);
    sVar7 = ggml_nbytes(lVar10);
    memcpy(pvVar1,local_3038 + 0x400,sVar7);
    uVar8 = ggml_map_custom2(uVar6,lVar5,lVar10,custom2,0xffffffff,g_userdata);
    uVar9 = ggml_new_graph(uVar6);
    ggml_build_forward_expand(uVar9,uVar8);
    ggml_graph_compute_with_ctx(uVar6,uVar9,4);
    lVar5 = ggml_get_data_f32(uVar8);
    lVar10 = ggml_nelements(uVar8);
    if (0 < lVar10) {
      lVar10 = 0;
      do {
        fVar21 = *(float *)(lVar5 + lVar10 * 4);
        if ((fVar21 != local_3038[lVar10] + local_3038[lVar10 + 0x400]) ||
           (NAN(fVar21) || NAN(local_3038[lVar10] + local_3038[lVar10 + 0x400]))) {
          pcVar14 = "output[i] == buf1_f32[i] + buf2_f32[i]";
          uVar6 = 0xe3;
          goto LAB_0010243a;
        }
        lVar10 = lVar10 + 1;
        lVar11 = ggml_nelements(uVar8);
      } while (lVar10 < lVar11);
    }
    if (g_custom2_count == 4) {
      ggml_free(uVar6);
      uVar6 = ggml_init();
      lVar5 = ggml_new_tensor_2d(uVar6,0,10,2);
      lVar10 = ggml_new_tensor_2d(uVar6,0,10,2);
      lVar11 = ggml_new_tensor_2d(uVar6,0,10,2);
      pvVar1 = *(void **)(lVar5 + 0xf8);
      sVar7 = ggml_nbytes(lVar5);
      memcpy(pvVar1,local_3038,sVar7);
      pvVar1 = *(void **)(lVar10 + 0xf8);
      sVar7 = ggml_nbytes(lVar10);
      memcpy(pvVar1,local_3038 + 0x400,sVar7);
      pvVar1 = *(void **)(lVar11 + 0xf8);
      sVar7 = ggml_nbytes(lVar11);
      memcpy(pvVar1,local_3038 + 0x800,sVar7);
      uVar8 = ggml_map_custom3(uVar6,lVar5,lVar10,lVar11,custom3,1,g_userdata);
      uVar9 = ggml_new_graph(uVar6);
      ggml_build_forward_expand(uVar9,uVar8);
      ggml_graph_compute_with_ctx(uVar6,uVar9,4);
      lVar5 = ggml_get_data_f32(uVar8);
      lVar10 = ggml_nelements(uVar8);
      if (0 < lVar10) {
        lVar10 = 0;
        do {
          fVar21 = *(float *)(lVar5 + lVar10 * 4);
          fVar24 = local_3038[lVar10] + local_3038[lVar10 + 0x400] + local_3038[lVar10 + 0x800];
          if ((fVar21 != fVar24) || (NAN(fVar21) || NAN(fVar24))) {
            pcVar14 = "output[i] == buf1_f32[i] + buf2_f32[i] + buf3_f32[i]";
            uVar6 = 0x101;
            goto LAB_0010243a;
          }
          lVar10 = lVar10 + 1;
          lVar11 = ggml_nelements(uVar8);
        } while (lVar10 < lVar11);
      }
      if (g_custom3_count == 1) {
        ggml_free(uVar6);
        uVar6 = ggml_init();
        lVar5 = ggml_new_tensor_2d(uVar6,0,10,2);
        lVar10 = ggml_new_tensor_2d(uVar6,0,10,2);
        lVar11 = ggml_new_tensor_2d(uVar6,0,10,2);
        lVar12 = ggml_new_tensor_2d(uVar6,0,10,2);
        lVar13 = ggml_new_tensor_2d(uVar6,0,10,2);
        pvVar1 = *(void **)(lVar5 + 0xf8);
        sVar7 = ggml_nbytes(lVar5);
        memcpy(pvVar1,local_3038,sVar7);
        pvVar1 = *(void **)(lVar10 + 0xf8);
        sVar7 = ggml_nbytes(lVar10);
        memcpy(pvVar1,local_3038 + 0x400,sVar7);
        pvVar1 = *(void **)(lVar11 + 0xf8);
        sVar7 = ggml_nbytes(lVar11);
        memcpy(pvVar1,local_3038 + 0x800,sVar7);
        pvVar1 = *(void **)(lVar12 + 0xf8);
        sVar7 = ggml_nbytes(lVar12);
        memcpy(pvVar1,local_3038,sVar7);
        pvVar1 = *(void **)(lVar13 + 0xf8);
        sVar7 = ggml_nbytes(lVar13);
        memcpy(pvVar1,local_3038 + 0x400,sVar7);
        local_3068 = lVar5;
        local_3060 = lVar10;
        local_3058 = lVar11;
        local_3050 = lVar12;
        local_3048 = lVar13;
        uVar8 = ggml_custom_4d(uVar6,0x1a,10,2,1,1,&local_3068,5,custom,0xffffffff,g_userdata);
        uVar9 = ggml_new_graph(uVar6);
        ggml_build_forward_expand(uVar9,uVar8);
        ggml_graph_compute_with_ctx(uVar6,uVar9,4);
        lVar5 = ggml_get_data(uVar8);
        lVar10 = ggml_nelements(uVar8);
        if (0 < lVar10) {
          lVar10 = 0;
          do {
            fVar21 = (float)*(int *)(lVar5 + lVar10 * 4);
            auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_3038[lVar10 + 0x800]),
                                     ZEXT416((uint)local_3038[lVar10 + 0x400]),
                                     ZEXT416((uint)local_3038[lVar10]));
            auVar3 = vfnmadd231ss_fma(auVar3,ZEXT416((uint)local_3038[lVar10]),
                                      ZEXT416((uint)local_3038[lVar10 + 0x400]));
            if ((auVar3._0_4_ != fVar21) || (NAN(auVar3._0_4_) || NAN(fVar21))) {
              pcVar14 = 
              "output[i] == buf1_f32[i] + buf2_f32[i] * buf3_f32[i] - buf1_f32[i] * buf2_f32[i]";
              uVar6 = 0x125;
              goto LAB_0010243a;
            }
            lVar10 = lVar10 + 1;
            lVar11 = ggml_nelements(uVar8);
          } while (lVar10 < lVar11);
        }
        ggml_free(uVar6);
        return 0;
      }
      pcVar14 = "g_custom3_count == 1";
      uVar6 = 0x104;
    }
    else {
      pcVar14 = "g_custom2_count == 4";
      uVar6 = 0xe6;
    }
  }
  else {
    pcVar14 = "g_custom1_count == 2";
    uVar6 = 0xcb;
  }
LAB_0010243a:
  iVar4 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-customop.c"
                     ,uVar6,"GGML_ASSERT(%s) failed",pcVar14);
  return iVar4;
}

Assistant:

int main(int argc, const char** argv) {

    float buf1_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf1_f32[i] = (float)(i + 1);
    }
    float buf2_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf2_f32[i] = (float)(i + 1) * 2;
    }
    float buf3_f32[1024];
    for (int i = 0; i < 1024; ++i) {
        buf3_f32[i] = (float)(i + 1) * 3;
    }

    // map_custom1
    // 2 tasks, no userdata, parallelized by elements
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t->data, buf1_f32, ggml_nbytes(t));

        struct ggml_tensor * m1 = ggml_map_custom1(ctx, t, custom1, 2, NULL);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m1);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m1);

        for (int i = 0; i < ggml_nelements(m1); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] * 2);
        }
        GGML_ASSERT(g_custom1_count == 2);

        ggml_free(ctx);
    }

    // map_custom2
    // max tasks (4), userdata, parallelized by rows
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));

        struct ggml_tensor * m2 = ggml_map_custom2(ctx, t1, t2, custom2, GGML_N_TASKS_MAX, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m2);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m2);

        for (int i = 0; i < ggml_nelements(m2); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i]);
        }

        GGML_ASSERT(g_custom2_count == 4);

        ggml_free(ctx);
    }

    // map_custom3
    // 1 task, userdata, not parallelized
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t3 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);

        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));
        memcpy(t3->data, buf3_f32, ggml_nbytes(t3));

        struct ggml_tensor * m3 = ggml_map_custom3(ctx, t1, t2, t3, custom3, 1, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m3);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const float * output = ggml_get_data_f32(m3);

        for (int i = 0; i < ggml_nelements(m3); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i] + buf3_f32[i]);
        }

        GGML_ASSERT(g_custom3_count == 1);

        ggml_free(ctx);
    }

    // custom
    {
        struct ggml_context * ctx = make_ctx();
        struct ggml_tensor * t1 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t2 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t3 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t4 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        struct ggml_tensor * t5 = ggml_new_tensor_2d(ctx, GGML_TYPE_F32, 10, 2);
        memcpy(t1->data, buf1_f32, ggml_nbytes(t1));
        memcpy(t2->data, buf2_f32, ggml_nbytes(t2));
        memcpy(t3->data, buf3_f32, ggml_nbytes(t3));
        memcpy(t4->data, buf1_f32, ggml_nbytes(t4));
        memcpy(t5->data, buf2_f32, ggml_nbytes(t5));

        struct ggml_tensor * args[] = {
            t1, t2, t3, t4, t5,
        };

        struct ggml_tensor * m4 = ggml_custom_4d(ctx, GGML_TYPE_I32, 10, 2, 1, 1, args, sizeof(args)/sizeof(args[0]), custom, GGML_N_TASKS_MAX, g_userdata);

        struct ggml_cgraph * graph = ggml_new_graph(ctx);
        ggml_build_forward_expand(graph, m4);

        ggml_graph_compute_with_ctx(ctx, graph, 4);

        const int32_t * output = (const int32_t *) ggml_get_data(m4);

        for (int i = 0; i < ggml_nelements(m4); ++i) {
            GGML_ASSERT(output[i] == buf1_f32[i] + buf2_f32[i] * buf3_f32[i] - buf1_f32[i] * buf2_f32[i]);
        }

        ggml_free(ctx);
    }

    return 0;
}